

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_sbit_decoder_load_bitmap
                   (TT_SBitDecoder decoder,FT_UInt glyph_format,FT_ULong glyph_start,
                   FT_ULong glyph_size,FT_Int x_pos,FT_Int y_pos,FT_UInt recurse_count,
                   FT_Bool metrics_only)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FT_UInt byte_size;
  FT_UInt bit_size;
  FT_UInt height;
  FT_UInt width;
  TT_SBitDecoder_LoadFunc loader;
  FT_Byte *data;
  FT_Byte *p_limit;
  FT_Byte *p;
  FT_Stream stream;
  FT_Int local_30;
  FT_Error error;
  FT_Int y_pos_local;
  FT_Int x_pos_local;
  FT_ULong glyph_size_local;
  FT_ULong glyph_start_local;
  TT_SBitDecoder pTStack_10;
  FT_UInt glyph_format_local;
  TT_SBitDecoder decoder_local;
  
  p = (FT_Byte *)decoder->stream;
  if ((glyph_size == 0) || (decoder->ebdt_size < glyph_start + glyph_size)) {
    return 6;
  }
  local_30 = y_pos;
  error = x_pos;
  _y_pos_local = glyph_size;
  glyph_size_local = glyph_start;
  glyph_start_local._4_4_ = glyph_format;
  pTStack_10 = decoder;
  stream._4_4_ = FT_Stream_Seek((FT_Stream)p,decoder->ebdt_start + glyph_start);
  if (stream._4_4_ != 0) {
    return stream._4_4_;
  }
  stream._4_4_ = FT_Stream_ExtractFrame((FT_Stream)p,_y_pos_local,(FT_Byte **)&loader);
  if (stream._4_4_ != 0) {
    return stream._4_4_;
  }
  p_limit = (FT_Byte *)loader;
  data = (FT_Byte *)(loader + _y_pos_local);
  if (glyph_start_local._4_4_ - 1 < 2) {
LAB_00334b9f:
    stream._4_4_ = tt_sbit_decoder_load_metrics(pTStack_10,&p_limit,data,'\0');
  }
  else if (glyph_start_local._4_4_ - 6 < 2) {
LAB_00334bb7:
    stream._4_4_ = tt_sbit_decoder_load_metrics(pTStack_10,&p_limit,data,'\x01');
  }
  else {
    if (glyph_start_local._4_4_ == 8) goto LAB_00334b9f;
    if (glyph_start_local._4_4_ == 9) goto LAB_00334bb7;
    if (glyph_start_local._4_4_ == 0x11) goto LAB_00334b9f;
    if (glyph_start_local._4_4_ == 0x12) goto LAB_00334bb7;
    stream._4_4_ = 0;
  }
  if (stream._4_4_ != 0) goto LAB_00334d23;
  switch(glyph_start_local._4_4_) {
  case 1:
  case 6:
    _height = tt_sbit_decoder_load_byte_aligned;
    break;
  case 2:
  case 7:
    uVar1 = (uint)pTStack_10->metrics->width;
    uVar2 = (uint)pTStack_10->metrics->height;
    uVar3 = uVar2 * (uVar1 + 7 >> 3);
    if ((uVar1 * uVar2 + 7 >> 3 < uVar3) && (uVar3 == (int)data - (int)p_limit)) {
      _height = tt_sbit_decoder_load_byte_aligned;
    }
    else {
      _height = tt_sbit_decoder_load_bit_aligned;
    }
    break;
  default:
    stream._4_4_ = 8;
    goto LAB_00334d23;
  case 5:
    _height = tt_sbit_decoder_load_bit_aligned;
    break;
  case 8:
    if (data < p_limit + 1) goto LAB_00334d23;
    p_limit = p_limit + 1;
  case 9:
    _height = tt_sbit_decoder_load_compound;
    break;
  case 0x11:
  case 0x12:
  case 0x13:
    stream._4_4_ = 7;
    goto LAB_00334d23;
  }
  if (((pTStack_10->bitmap_allocated != '\0') ||
      (stream._4_4_ = tt_sbit_decoder_alloc_bitmap(pTStack_10,metrics_only), stream._4_4_ == 0)) &&
     (metrics_only == '\0')) {
    stream._4_4_ = (*_height)(pTStack_10,p_limit,data,error,local_30,recurse_count);
  }
LAB_00334d23:
  FT_Stream_ReleaseFrame((FT_Stream)p,(FT_Byte **)&loader);
  return stream._4_4_;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_bitmap( TT_SBitDecoder  decoder,
                               FT_UInt         glyph_format,
                               FT_ULong        glyph_start,
                               FT_ULong        glyph_size,
                               FT_Int          x_pos,
                               FT_Int          y_pos,
                               FT_UInt         recurse_count,
                               FT_Bool         metrics_only )
  {
    FT_Error   error;
    FT_Stream  stream = decoder->stream;
    FT_Byte*   p;
    FT_Byte*   p_limit;
    FT_Byte*   data;


    /* seek into the EBDT table now */
    if ( !glyph_size                                   ||
         glyph_start + glyph_size > decoder->ebdt_size )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( FT_STREAM_SEEK( decoder->ebdt_start + glyph_start ) ||
         FT_FRAME_EXTRACT( glyph_size, data )                )
      goto Exit;

    p       = data;
    p_limit = p + glyph_size;

    /* read the data, depending on the glyph format */
    switch ( glyph_format )
    {
    case 1:
    case 2:
    case 8:
    case 17:
      error = tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 0 );
      break;

    case 6:
    case 7:
    case 9:
    case 18:
      error = tt_sbit_decoder_load_metrics( decoder, &p, p_limit, 1 );
      break;

    default:
      error = FT_Err_Ok;
    }

    if ( error )
      goto Fail;

    {
      TT_SBitDecoder_LoadFunc  loader;


      switch ( glyph_format )
      {
      case 1:
      case 6:
        loader = tt_sbit_decoder_load_byte_aligned;
        break;

      case 2:
      case 7:
        {
          /* Don't trust `glyph_format'.  For example, Apple's main Korean */
          /* system font, `AppleMyungJo.ttf' (version 7.0d2e6), uses glyph */
          /* format 7, but the data is format 6.  We check whether we have */
          /* an excessive number of bytes in the image: If it is equal to  */
          /* the value for a byte-aligned glyph, use the other loading     */
          /* routine.                                                      */
          /*                                                               */
          /* Note that for some (width,height) combinations, where the     */
          /* width is not a multiple of 8, the sizes for bit- and          */
          /* byte-aligned data are equal, for example (7,7) or (15,6).  We */
          /* then prefer what `glyph_format' specifies.                    */

          FT_UInt  width  = decoder->metrics->width;
          FT_UInt  height = decoder->metrics->height;

          FT_UInt  bit_size  = ( width * height + 7 ) >> 3;
          FT_UInt  byte_size = height * ( ( width + 7 ) >> 3 );


          if ( bit_size < byte_size                  &&
               byte_size == (FT_UInt)( p_limit - p ) )
            loader = tt_sbit_decoder_load_byte_aligned;
          else
            loader = tt_sbit_decoder_load_bit_aligned;
        }
        break;

      case 5:
        loader = tt_sbit_decoder_load_bit_aligned;
        break;

      case 8:
        if ( p + 1 > p_limit )
          goto Fail;

        p += 1;  /* skip padding */
        FALL_THROUGH;

      case 9:
        loader = tt_sbit_decoder_load_compound;
        break;

      case 17: /* small metrics, PNG image data   */
      case 18: /* big metrics, PNG image data     */
      case 19: /* metrics in EBLC, PNG image data */
#ifdef FT_CONFIG_OPTION_USE_PNG
        loader = tt_sbit_decoder_load_png;
        break;
#else
        error = FT_THROW( Unimplemented_Feature );
        goto Fail;
#endif /* FT_CONFIG_OPTION_USE_PNG */

      default:
        error = FT_THROW( Invalid_Table );
        goto Fail;
      }

      if ( !decoder->bitmap_allocated )
      {
        error = tt_sbit_decoder_alloc_bitmap( decoder, metrics_only );

        if ( error )
          goto Fail;
      }

      if ( metrics_only )
        goto Fail; /* this is not an error */

      error = loader( decoder, p, p_limit, x_pos, y_pos, recurse_count );
    }

  Fail:
    FT_FRAME_RELEASE( data );

  Exit:
    return error;
  }